

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddP70string(Node *this,string *name,string *value)

{
  Node n;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  Node local_88;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"P",&local_e9);
  Node(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)name);
  std::__cxx11::string::string((string *)&local_e8,(string *)value);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,std::__cxx11::string>
            (&local_88,&local_c8,"KString","","",&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_88);
  ~Node(&local_88);
  return;
}

Assistant:

void FBX::Node::AddP70string(
    const std::string& name, const std::string& value
) {
    FBX::Node n("P");
    n.AddProperties(name, "KString", "", "", value);
    AddChild(n);
}